

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

ParameterError parse_localport(OperationConfig *config,char *nextarg)

{
  bool bVar1;
  ParameterError PVar2;
  char *pcVar3;
  size_t plen;
  char buffer [22];
  char *p;
  char *pp;
  char *nextarg_local;
  OperationConfig *config_local;
  
  p = (char *)0x0;
  unique0x100000fc = nextarg;
  while( true ) {
    bVar1 = false;
    if ('/' < *stack0xffffffffffffffd0) {
      bVar1 = *stack0xffffffffffffffd0 < ':';
    }
    if (!bVar1) break;
    register0x00000000 = stack0xffffffffffffffd0 + 1;
  }
  pcVar3 = p;
  if (*stack0xffffffffffffffd0 != '\0') {
    p = stack0xffffffffffffffd0;
    if ((*stack0xffffffffffffffd0 == ' ') || (*stack0xffffffffffffffd0 == '\t')) {
      p = stack0xffffffffffffffd0 + 1;
    }
    if (*p != '-') {
      return PARAM_BAD_USE;
    }
    pcVar3 = p + 1;
    if ((*pcVar3 == ' ') || (*pcVar3 == '\t')) {
      pcVar3 = p + 2;
    }
  }
  p = pcVar3;
  curl_msnprintf(&plen,0x16,"%.*s",(long)stack0xffffffffffffffd0 - (long)nextarg & 0xffffffff,
                 nextarg);
  PVar2 = str2unummax(&config->localport,(char *)&plen,0xffff);
  if (PVar2 != PARAM_OK) {
    return PARAM_BAD_USE;
  }
  if (p == (char *)0x0) {
    config->localportrange = 1;
  }
  else {
    PVar2 = str2unummax(&config->localportrange,p,0xffff);
    if (PVar2 != PARAM_OK) {
      return PARAM_BAD_USE;
    }
    config->localportrange = config->localportrange - (config->localport + -1);
    if (config->localportrange < 1) {
      return PARAM_BAD_USE;
    }
  }
  return PARAM_OK;
}

Assistant:

static ParameterError parse_localport(struct OperationConfig *config,
                                      const char *nextarg)
{
  const char *pp = NULL;
  const char *p = nextarg;
  char buffer[22];
  size_t plen = 0;
  while(ISDIGIT(*p))
    p++;
  plen = p - nextarg;
  if(*p) {
    pp = p;
    /* check for ' - [end]' */
    if(ISBLANK(*pp))
      pp++;
    if(*pp != '-')
      return PARAM_BAD_USE;
    pp++;
    if(ISBLANK(*pp))
      pp++;
  }
  msnprintf(buffer, sizeof(buffer), "%.*s", (int)plen, nextarg);
  if(str2unummax(&config->localport, buffer, 65535))
    return PARAM_BAD_USE;
  if(!pp)
    config->localportrange = 1; /* default number of ports to try */
  else {
    if(str2unummax(&config->localportrange, pp, 65535))
      return PARAM_BAD_USE;
    config->localportrange -= (config->localport-1);
    if(config->localportrange < 1)
      return PARAM_BAD_USE;
  }
  return PARAM_OK;
}